

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_singleton.h
# Opt level: O0

void __thiscall
singleton_factory_t<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>,__ze_rtas_parallel_operation_exp_handle_t_*>
::release(singleton_factory_t<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>,__ze_rtas_parallel_operation_exp_handle_t_*>
          *this,_ze_rtas_parallel_operation_exp_handle_t *_key)

{
  key_t local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lk;
  _ze_rtas_parallel_operation_exp_handle_t *_key_local;
  singleton_factory_t<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>,__ze_rtas_parallel_operation_exp_handle_t_*>
  *this_local;
  
  lk._M_device = (mutex_type *)_key;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mut);
  local_28 = getKey<>(this,(_ze_rtas_parallel_operation_exp_handle_t *)lk._M_device);
  std::
  unordered_map<unsigned_long,_std::unique_ptr<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>,_std::default_delete<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>,_std::default_delete<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>_>_>_>_>_>
  ::erase(&this->map,&local_28);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void release( _key_t _key )
    {
        std::lock_guard<std::mutex> lk( mut );
        map.erase( getKey( _key ) );
    }